

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,StringTree *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,
          ArrayPtr<const_char> *params_10)

{
  ArrayPtr<const_char> *rest_3;
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_c8;
  StringTree *local_b0;
  ArrayPtr<const_char> *local_a8;
  ArrayPtr<const_char> *local_a0;
  ArrayPtr<const_char> *local_98;
  ArrayPtr<const_char> *local_90;
  char *local_88;
  size_t sStack_80;
  size_t local_78;
  size_t sStack_70;
  size_t local_68;
  char *local_60;
  char *local_58;
  size_t sStack_50;
  size_t local_48;
  size_t sStack_40;
  size_t local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_88 = (this->text).content.ptr;
  sStack_80 = params->size_;
  local_78 = params_1->size_;
  sStack_70 = params_2->size_;
  local_68 = params_3->size_;
  local_60 = params_4->ptr;
  local_58 = (params_5->text).content.ptr;
  sStack_50 = params_6->size_;
  local_48 = params_7->size_;
  sStack_40 = params_8->size_;
  local_38 = params_9->size_;
  nums._M_len = (size_type)params_9;
  nums._M_array = (iterator)0xb;
  local_90 = params_3;
  sVar1 = _::sum((_ *)&local_88,nums);
  rest_3 = local_90;
  __return_storage_ptr__->size_ = sVar1;
  local_88 = (this->text).content.ptr;
  sStack_80 = params->size_;
  local_78 = params_1->size_;
  sStack_70 = params_2->size_;
  local_68 = local_90->size_;
  local_60 = (char *)0x0;
  local_58 = (params_5->text).content.ptr;
  sStack_50 = params_6->size_;
  local_48 = params_7->size_;
  sStack_40 = params_8->size_;
  local_38 = params_9->size_;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0xb;
  local_b0 = this;
  local_a8 = params;
  local_a0 = params_1;
  local_98 = params_2;
  sVar1 = _::sum((_ *)&local_88,nums_00);
  heapString((String *)&local_c8,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_c8);
  Array<char>::~Array((Array<char> *)&local_c8);
  local_68 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = (char *)0x0;
  sStack_80 = 0;
  local_60 = (char *)0x1;
  local_58 = (char *)0x0;
  sStack_50 = 0;
  local_48 = 0;
  sStack_40 = 0;
  local_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0xb;
  sVar1 = _::sum((_ *)&local_88,nums_01);
  local_c8.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_c8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_c8.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_c8);
  Array<kj::StringTree::Branch>::~Array(&local_c8);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_b0,local_a8,local_a0,
             local_98,rest_3,(StringTree *)params_4,(ArrayPtr<const_char> *)params_5,params_6,
             params_7,params_8,params_9);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}